

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O1

hbtrie_result hbtrie_find_offset(hbtrie *trie,void *rawkey,int rawkeylen,void *valuebuf)

{
  byte bVar1;
  long lVar2;
  int keylen;
  hbtrie_result hVar3;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  
  bVar1 = trie->chunksize;
  lVar2 = -(((long)((int)(rawkeylen + (uint)bVar1 + -1) / (int)(uint)bVar1) + 1) * (ulong)bVar1 +
            0xf & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x12c85a;
  keylen = _hbtrie_reform_key(trie,rawkey,rawkeylen,auStack_28 + lVar2);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x12c873;
  hVar3 = _hbtrie_find(trie,auStack_28 + lVar2,keylen,valuebuf,(list *)0x0,'\x01');
  return hVar3;
}

Assistant:

hbtrie_result hbtrie_find_offset(struct hbtrie *trie, void *rawkey,
                                 int rawkeylen, void *valuebuf)
{
    int nchunk = _get_nchunk_raw(trie, rawkey, rawkeylen);
    uint8_t *key = alca(uint8_t, nchunk * trie->chunksize);
    int keylen;

    keylen = _hbtrie_reform_key(trie, rawkey, rawkeylen, key);
    return _hbtrie_find(trie, key, keylen, valuebuf, NULL,
                        HBTRIE_PREFIX_MATCH_ONLY);
}